

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_footer_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  ulong uVar1;
  undefined1 local_40 [8];
  string footer;
  App *app_local;
  Formatter *this_local;
  
  footer.field_2._8_8_ = app;
  App::get_footer_abi_cxx11_((string *)local_40,app);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "\n");
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_footer(const App *app) const {
    std::string footer = app->get_footer();
    if(footer.empty()) {
        return std::string{};
    }
    return footer + "\n";
}